

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O1

char * test_matrix2_inverse(void)

{
  int iVar1;
  matrix2 *pmVar2;
  char *pcVar3;
  matrix2 originalMatrix;
  matrix2 inverted;
  matrix2 identity;
  matrix2 scratchMatrix;
  anon_union_16_5_d0a4420b_for_matrix2_0 local_48;
  matrix2 local_38;
  matrix2 local_28;
  matrix2 local_18;
  
  local_48.m[0] = 2.0;
  local_48.m[1] = 0.0;
  local_48.m[2] = -1.0;
  local_48.m[3] = 5.0;
  matrix2_identity(&local_28);
  matrix2_identity((matrix2 *)&local_48.field_1);
  pmVar2 = matrix2_set(&local_38,(matrix2 *)&local_48.field_1);
  pmVar2 = matrix2_invert(pmVar2);
  if (pmVar2 == (matrix2 *)0x0) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(125) : (assertion failed) ((hasInverse))"
    ;
  }
  else {
    matrix2_identity(&local_18);
    matrix2_multiply(&local_18,&local_38);
    matrix2_multiply(&local_18,(matrix2 *)&local_48.field_1);
    iVar1 = matrix2_equals(&local_28,&local_18);
    pcVar3 = (char *)0x0;
    if (iVar1 == 0) {
      pcVar3 = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(131) : (assertion failed) ((matrix2_equals(&identity, &scratchMatrix)))"
      ;
    }
  }
  return pcVar3;
}

Assistant:

static char *test_matrix2_inverse(void)
{
	struct matrix2 originalMatrix = {2, 0, -1, 5};
	struct matrix2 identity;
	struct matrix2 inverted;
	struct matrix2 scratchMatrix;
	void *hasInverse = NULL;

	matrix2_identity(&identity);

	matrix2_identity(&originalMatrix);

	hasInverse = matrix2_invert(matrix2_set(&inverted, &originalMatrix));

	test_assert(hasInverse);

	matrix2_identity(&scratchMatrix);
	matrix2_multiply(&scratchMatrix, &inverted);
	matrix2_multiply(&scratchMatrix, &originalMatrix);

	test_assert(matrix2_equals(&identity, &scratchMatrix));

	return NULL;
}